

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemViewPrivate::fetchMore(QAbstractItemViewPrivate *this)

{
  QPersistentModelIndex *this_00;
  long *plVar1;
  char cVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QModelIndex *__return_storage_ptr__;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  pQVar4 = this->model;
  this_00 = &this->root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  cVar2 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&local_58);
  if (cVar2 != '\0') {
    pQVar4 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&local_58);
    if (iVar3 < 1) {
      pQVar4 = this->model;
      __return_storage_ptr__ = &local_58;
    }
    else {
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = this->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar3 + -1,0,&local_70);
      plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.field_0x8;
      (**(code **)(*plVar1 + 0x1e0))(plVar1,&local_58);
      local_70._0_16_ = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
      cVar2 = QRect::intersects((QRect *)&local_70);
      if (cVar2 == '\0') goto LAB_004e56ea;
      pQVar4 = this->model;
      __return_storage_ptr__ = &local_70;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,this_00);
    (**(code **)(*(long *)pQVar4 + 0x128))(pQVar4,__return_storage_ptr__);
  }
LAB_004e56ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::fetchMore()
{
    fetchMoreTimer.stop();
    if (!model->canFetchMore(root))
        return;
    int last = model->rowCount(root) - 1;
    if (last < 0) {
        model->fetchMore(root);
        return;
    }

    QModelIndex index = model->index(last, 0, root);
    QRect rect = q_func()->visualRect(index);
    if (viewport->rect().intersects(rect))
        model->fetchMore(root);
}